

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_6f47f7::TestSignatureChecker::CheckECDSASignature
          (TestSignatureChecker *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *sig,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *pubkey,CScript *scriptcode,
          SigVersion sigversion)

{
  long lVar1;
  Span<const_unsigned_char> _vch;
  bool bVar2;
  size_t in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  undefined4 in_R8D;
  long in_FS_OFFSET;
  const_iterator it;
  CPubKey pk;
  key_type *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  Span<const_unsigned_char> *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  undefined1 local_71;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Span<unsigned_char_const>::Span<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (in_stack_ffffffffffffff58,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
             CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  _vch.m_data._4_4_ = in_R8D;
  _vch.m_data._0_4_ = in_stack_ffffffffffffff60;
  _vch.m_size = in_RCX;
  CPubKey::CPubKey((CPubKey *)in_stack_ffffffffffffff58,_vch);
  bVar2 = CPubKey::IsValid(in_stack_ffffffffffffff48);
  if (bVar2) {
    std::
    unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
    ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                  *)in_stack_ffffffffffffff48);
    std::
    map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::find((map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
            *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50),
           in_stack_ffffffffffffff48);
    std::
    unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
    ::operator->((unique_ptr<const_(anonymous_namespace)::TestData,_std::default_delete<const_(anonymous_namespace)::TestData>_>
                  *)in_stack_ffffffffffffff48);
    std::
    map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
    ::end((map<CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<CPubKey>,_std::allocator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
           *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    bVar2 = std::operator==((_Self *)in_stack_ffffffffffffff58,
                            (_Self *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    if (bVar2) {
      local_71 = false;
    }
    else {
      std::
      _Rb_tree_const_iterator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
      ::operator->((_Rb_tree_const_iterator<std::pair<const_CPubKey,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                    *)in_stack_ffffffffffffff48);
      local_71 = std::operator==(in_RSI,in_RDX);
    }
  }
  else {
    local_71 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_71;
  }
  __stack_chk_fail();
}

Assistant:

bool CheckECDSASignature(const std::vector<unsigned char>& sig, const std::vector<unsigned char>& pubkey, const CScript& scriptcode, SigVersion sigversion) const override {
        CPubKey pk(pubkey);
        if (!pk.IsValid()) return false;
        // Instead of actually running signature validation, check if the signature matches the precomputed one for this key.
        auto it = g_testdata->signatures.find(pk);
        if (it == g_testdata->signatures.end()) return false;
        return sig == it->second;
    }